

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeRule
          (cmLocalUnixMakefileGenerator3 *this,ostream *os,char *comment,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *commands,bool symbolic,bool in_help)

{
  cmMakefile *this_00;
  string_view sep;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  string *psVar5;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  string_view local_200;
  string_view local_1f0;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  reference local_180;
  string *depend;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_158;
  cmValue local_138;
  cmValue sym;
  char *space;
  undefined1 local_108 [8];
  string tgt;
  string local_c8 [32];
  long local_a8;
  size_type rpos;
  size_type lpos;
  string replace;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string err;
  bool in_help_local;
  bool symbolic_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  string *target_local;
  char *comment_local;
  ostream *os_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  err.field_2._M_local_buf[0xf] = symbolic;
  err.field_2._M_local_buf[0xe] = in_help;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&lpos);
    if (comment != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&lpos,comment);
      rpos = 0;
      while (local_a8 = std::__cxx11::string::find((char)&lpos,10), local_a8 != -1) {
        poVar3 = std::operator<<(os,"# ");
        std::__cxx11::string::substr((ulong)local_c8,(ulong)&lpos);
        poVar3 = std::operator<<(poVar3,local_c8);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string(local_c8);
        rpos = local_a8 + 1;
      }
      poVar3 = std::operator<<(os,"# ");
      std::__cxx11::string::substr((ulong)((long)&tgt.field_2 + 8),(ulong)&lpos);
      poVar3 = std::operator<<(poVar3,(string *)(tgt.field_2._M_local_buf + 8));
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)(tgt.field_2._M_local_buf + 8));
    }
    cmOutputConverter::MaybeRelativeToTopBinDir((string *)&space,(cmOutputConverter *)this,target);
    ConvertToMakefilePath((string *)local_108,this,(string *)&space);
    std::__cxx11::string::~string((string *)&space);
    sym.Value = (string *)0x1017437;
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 1) {
      sym.Value = (string *)0xfb555e;
    }
    if ((err.field_2._M_local_buf[0xf] & 1U) != 0) {
      this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"CMAKE_MAKE_SYMBOLIC_RULE",
                 (allocator<char> *)((long)&__range2 + 7));
      local_138 = cmMakefile::GetDefinition(this_00,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      bVar1 = cmValue::operator_cast_to_bool(&local_138);
      if (bVar1) {
        poVar3 = std::operator<<(os,(string *)local_108);
        poVar3 = std::operator<<(poVar3,(char *)sym.Value);
        poVar3 = std::operator<<(poVar3,": ");
        psVar5 = cmValue::operator*[abi_cxx11_(&local_138);
        poVar3 = std::operator<<(poVar3,(string *)psVar5);
        std::operator<<(poVar3,"\n");
      }
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(depends);
    if (bVar1) {
      poVar3 = std::operator<<(os,(string *)local_108);
      poVar3 = std::operator<<(poVar3,(char *)sym.Value);
      std::operator<<(poVar3,":\n");
    }
    else {
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(depends);
      depend = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(depends);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&depend), bVar1) {
        local_180 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
        poVar3 = std::operator<<(os,(string *)local_108);
        poVar3 = std::operator<<(poVar3,(char *)sym.Value);
        poVar3 = std::operator<<(poVar3,": ");
        cmOutputConverter::MaybeRelativeToTopBinDir(&local_1c0,(cmOutputConverter *)this,local_180);
        ConvertToMakefilePath(&local_1a0,this,&local_1c0);
        poVar3 = std::operator<<(poVar3,(string *)&local_1a0);
        std::operator<<(poVar3,'\n');
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(commands);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,"\t");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200,"");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_210,"\n");
      sep._M_str = local_210._M_str;
      sep._M_len = local_210._M_len;
      cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_1e0,local_1f0,commands,local_200,sep);
      poVar3 = std::operator<<(os,(string *)&local_1e0);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    if (((err.field_2._M_local_buf[0xf] & 1U) != 0) &&
       (bVar1 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this), !bVar1)) {
      poVar3 = std::operator<<(os,".PHONY : ");
      poVar3 = std::operator<<(poVar3,(string *)local_108);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<(os,"\n");
    if ((err.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->LocalHelp,target);
    }
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&lpos);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"No target for WriteMakeRule! called with comment: ",&local_61);
    std::allocator<char>::~allocator(&local_61);
    if (comment != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)local_60,comment);
    }
    cmSystemTools::Error((string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeRule(
  std::ostream& os, const char* comment, const std::string& target,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands, bool symbolic, bool in_help)
{
  // Make sure there is a target.
  if (target.empty()) {
    std::string err("No target for WriteMakeRule! called with comment: ");
    if (comment) {
      err += comment;
    }
    cmSystemTools::Error(err);
    return;
  }

  std::string replace;

  // Write the comment describing the rule in the makefile.
  if (comment) {
    replace = comment;
    std::string::size_type lpos = 0;
    std::string::size_type rpos;
    while ((rpos = replace.find('\n', lpos)) != std::string::npos) {
      os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
      lpos = rpos + 1;
    }
    os << "# " << replace.substr(lpos) << "\n";
  }

  // Construct the left hand side of the rule.
  std::string tgt =
    this->ConvertToMakefilePath(this->MaybeRelativeToTopBinDir(target));

  const char* space = "";
  if (tgt.size() == 1) {
    // Add a space before the ":" to avoid drive letter confusion on
    // Windows.
    space = " ";
  }

  // Mark the rule as symbolic if requested.
  if (symbolic) {
    if (cmValue sym =
          this->Makefile->GetDefinition("CMAKE_MAKE_SYMBOLIC_RULE")) {
      os << tgt << space << ": " << *sym << "\n";
    }
  }

  // Write the rule.
  if (depends.empty()) {
    // No dependencies.  The commands will always run.
    os << tgt << space << ":\n";
  } else {
    // Split dependencies into multiple rule lines.  This allows for
    // very long dependency lists even on older make implementations.
    for (std::string const& depend : depends) {
      os << tgt << space << ": "
         << this->ConvertToMakefilePath(this->MaybeRelativeToTopBinDir(depend))
         << '\n';
    }
  }

  if (!commands.empty()) {
    // Write the list of commands.
    os << cmWrap("\t", commands, "", "\n") << "\n";
  }
  if (symbolic && !this->IsWatcomWMake()) {
    os << ".PHONY : " << tgt << "\n";
  }
  os << "\n";
  // Add the output to the local help if requested.
  if (in_help) {
    this->LocalHelp.push_back(target);
  }
}